

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button.cpp
# Opt level: O2

bool __thiscall ftxui::anon_unknown_3::ButtonBase::OnEvent(ButtonBase *this,Event *event)

{
  bool bVar1;
  __type _Var2;
  _func_int **local_20;
  
  if ((event->type_ == Mouse) &&
     (bVar1 = Box::Contain(&this->box_,(event->field_1).mouse_.x,(event->field_1).mouse_.y), bVar1))
  {
    ComponentBase::CaptureMouse((ComponentBase *)&stack0xffffffffffffffe0,(Event *)this);
    if (local_20 != (_func_int **)0x0) {
      (**(code **)(*local_20 + 8))();
      ComponentBase::TakeFocus(&this->super_ComponentBase);
      if (((event->field_1).mouse_.button == Left) && ((event->field_1).mouse_.motion == Pressed))
      goto LAB_0012f2db;
    }
  }
  else {
    _Var2 = std::operator==(&event->input_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (Event::Return + 0x18));
    if (_Var2) {
LAB_0012f2db:
      std::function<void_()>::operator()(&this->on_click_);
      return true;
    }
  }
  return false;
}

Assistant:

bool OnEvent(Event event) override {
    if (event.is_mouse() && box_.Contain(event.mouse().x, event.mouse().y)) {
      if (!CaptureMouse(event))
        return false;

      TakeFocus();

      if (event.mouse().button == Mouse::Left &&
          event.mouse().motion == Mouse::Pressed) {
        on_click_();
        return true;
      }

      return false;
    }

    if (event == Event::Return) {
      on_click_();
      return true;
    }
    return false;
  }